

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsystemsemaphore_systemv.cpp
# Opt level: O0

bool __thiscall
QSystemSemaphoreSystemV::modifySemaphore
          (QSystemSemaphoreSystemV *this,QSystemSemaphorePrivate *self,int count)

{
  key_t kVar1;
  int iVar2;
  int *piVar3;
  int in_EDX;
  QSystemSemaphoreSystemV *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  QSystemSemaphorePrivate *in_stack_00000018;
  int res;
  sembuf operation;
  AccessMode in_stack_0000005c;
  QSystemSemaphorePrivate *in_stack_00000060;
  QSystemSemaphoreSystemV *in_stack_00000068;
  undefined1 in_stack_00000180 [16];
  QSystemSemaphorePrivate *in_stack_ffffffffffffffb0;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 uVar4;
  undefined1 in_stack_ffffffffffffffc8 [16];
  int count_00;
  bool local_f;
  sembuf local_e;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  kVar1 = handle(in_stack_00000068,in_stack_00000060,in_stack_0000005c);
  if (kVar1 == -1) {
    local_f = false;
  }
  else {
    local_e._0_4_ = in_EDX << 0x10;
    local_e.sem_flg = 0x1000;
    do {
      iVar2 = semop(*(int *)(in_RDI + 0x1c),&local_e,1);
      uVar4 = false;
      if (iVar2 == -1) {
        piVar3 = __errno_location();
        uVar4 = *piVar3 == 4;
      }
    } while ((bool)uVar4 != false);
    if (iVar2 == -1) {
      piVar3 = __errno_location();
      if (*piVar3 != 0x16) {
        piVar3 = __errno_location();
        if (*piVar3 != 0x2b) {
          Qt::Literals::StringLiterals::operator____L1
                    ((char *)CONCAT17(uVar4,in_stack_ffffffffffffffb8),(size_t)in_RSI);
          QSystemSemaphorePrivate::setUnixErrorString
                    (in_stack_00000018,(QLatin1StringView)in_stack_00000180);
          local_f = false;
          goto LAB_008d5a71;
        }
      }
      *(undefined4 *)(in_RDI + 0x1c) = 0xffffffff;
      cleanHandle(in_stack_ffffffffffffffc8._8_8_,in_stack_ffffffffffffffc8._0_8_);
      count_00 = in_stack_ffffffffffffffc8._12_4_;
      handle(in_stack_00000068,in_stack_00000060,in_stack_0000005c);
      local_f = modifySemaphore(in_RSI,(QSystemSemaphorePrivate *)CONCAT44(in_EDX,iVar2),count_00);
    }
    else {
      QSystemSemaphorePrivate::clearError(in_stack_ffffffffffffffb0);
      local_f = true;
    }
  }
LAB_008d5a71:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_f;
  }
  __stack_chk_fail();
}

Assistant:

bool QSystemSemaphoreSystemV::modifySemaphore(QSystemSemaphorePrivate *self, int count)
{
    if (handle(self, QSystemSemaphore::Open) == -1)
        return false;

    struct sembuf operation;
    operation.sem_num = 0;
    operation.sem_op = count;
    operation.sem_flg = SEM_UNDO;

    int res;
    QT_EINTR_LOOP(res, semop(semaphore, &operation, 1));
    if (-1 == res) {
        // If the semaphore was removed be nice and create it and then modifySemaphore again
        if (errno == EINVAL || errno == EIDRM) {
            semaphore = -1;
            cleanHandle(self);
            handle(self, QSystemSemaphore::Open);
            return modifySemaphore(self, count);
        }
        self->setUnixErrorString("QSystemSemaphore::modifySemaphore"_L1);
#if defined QSYSTEMSEMAPHORE_DEBUG
        qDebug("QSystemSemaphoreSystemV::modify failed %d %d %d %d %d",
               count, int(semctl(semaphore, 0, GETVAL)), int(errno), int(EIDRM), int(EINVAL);
#endif
        return false;
    }

    self->clearError();
    return true;
}